

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void WindowSettingsHandler_ReadLine
               (ImGuiContext_conflict1 *param_1,ImGuiSettingsHandler_conflict1 *param_2,void *entry,
               char *line)

{
  int iVar1;
  ImU32 u1;
  int y;
  int x;
  int i;
  undefined4 local_20;
  int local_1c;
  ushort local_18 [2];
  int local_14;
  
  iVar1 = __isoc99_sscanf(line,"Pos=%i,%i",local_18,&local_1c);
  if (iVar1 == 2) {
    *(uint *)((long)entry + 4) = local_1c << 0x10 | (uint)local_18[0];
  }
  else {
    iVar1 = __isoc99_sscanf(line,"Size=%i,%i",local_18,&local_1c);
    if (iVar1 == 2) {
      *(uint *)((long)entry + 8) = local_1c << 0x10 | (uint)local_18[0];
    }
    else {
      iVar1 = __isoc99_sscanf(line,"ViewportId=0x%08X",&local_20);
      if (iVar1 == 1) {
        *(undefined4 *)((long)entry + 0x10) = local_20;
      }
      else {
        iVar1 = __isoc99_sscanf(line,"ViewportPos=%i,%i",local_18,&local_1c);
        if (iVar1 == 2) {
          *(uint *)((long)entry + 0xc) = local_1c << 0x10 | (uint)local_18[0];
        }
        else {
          iVar1 = __isoc99_sscanf(line,"Collapsed=%d",&local_14);
          if (iVar1 == 1) {
            *(bool *)((long)entry + 0x1e) = local_14 != 0;
          }
          else {
            iVar1 = __isoc99_sscanf(line,"DockId=0x%X,%d",&local_20,&local_14);
            if (iVar1 == 2) {
              *(undefined4 *)((long)entry + 0x14) = local_20;
              *(undefined2 *)((long)entry + 0x1c) = (undefined2)local_14;
            }
            else {
              iVar1 = __isoc99_sscanf(line,"DockId=0x%X",&local_20);
              if (iVar1 == 1) {
                *(undefined4 *)((long)entry + 0x14) = local_20;
                *(undefined2 *)((long)entry + 0x1c) = 0xffff;
              }
              else {
                iVar1 = __isoc99_sscanf(line,"ClassId=0x%X",&local_20);
                if (iVar1 == 1) {
                  *(undefined4 *)((long)entry + 0x18) = local_20;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void WindowSettingsHandler_ReadLine(ImGuiContext*, ImGuiSettingsHandler*, void* entry, const char* line)
{
    ImGuiWindowSettings* settings = (ImGuiWindowSettings*)entry;
    int x, y;
    int i;
    ImU32 u1;
    if (sscanf(line, "Pos=%i,%i", &x, &y) == 2)             { settings->Pos = ImVec2ih((short)x, (short)y); }
    else if (sscanf(line, "Size=%i,%i", &x, &y) == 2)       { settings->Size = ImVec2ih((short)x, (short)y); }
    else if (sscanf(line, "ViewportId=0x%08X", &u1) == 1)   { settings->ViewportId = u1; }
    else if (sscanf(line, "ViewportPos=%i,%i", &x, &y) == 2){ settings->ViewportPos = ImVec2ih((short)x, (short)y); }
    else if (sscanf(line, "Collapsed=%d", &i) == 1)         { settings->Collapsed = (i != 0); }
    else if (sscanf(line, "DockId=0x%X,%d", &u1, &i) == 2)  { settings->DockId = u1; settings->DockOrder = (short)i; }
    else if (sscanf(line, "DockId=0x%X", &u1) == 1)         { settings->DockId = u1; settings->DockOrder = -1; }
    else if (sscanf(line, "ClassId=0x%X", &u1) == 1)        { settings->ClassId = u1; }
}